

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall QList<DomActionGroup_*>::clear(QList<DomActionGroup_*> *this)

{
  Data *pDVar1;
  qsizetype capacity;
  long in_FS_OFFSET;
  pair<QTypedArrayData<DomActionGroup_*>_*,_DomActionGroup_**> pVar2;
  QArrayDataPointer<DomActionGroup_*> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).size != 0) {
    pDVar1 = (this->d).d;
    if (pDVar1 == (Data *)0x0) {
      capacity = 0;
    }
    else {
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
        (this->d).size = 0;
        goto LAB_001632d9;
      }
      capacity = (pDVar1->super_QArrayData).alloc;
    }
    local_28.size = -0x5555555555555556;
    local_28.ptr = (DomActionGroup **)0xaaaaaaaaaaaaaaaa;
    pVar2 = QTypedArrayData<DomActionGroup_*>::allocate(capacity,KeepSize);
    local_28.d = (this->d).d;
    local_28.ptr = (this->d).ptr;
    (this->d).d = pVar2.first;
    (this->d).ptr = pVar2.second;
    local_28.size = (this->d).size;
    (this->d).size = 0;
    QArrayDataPointer<DomActionGroup_*>::~QArrayDataPointer(&local_28);
  }
LAB_001632d9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }